

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed,int flag,HelicsError *err)

{
  uint uVar1;
  Federate *pFVar2;
  uint in_ESI;
  bool res;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  uint local_4;
  
  pFVar2 = getFed((HelicsFederate)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8);
  if (pFVar2 == (Federate *)0x0) {
    local_4 = 0;
  }
  else {
    uVar1 = (*pFVar2->_vptr_Federate[8])(pFVar2,(ulong)in_ESI);
    local_4 = (uint)((uVar1 & 1) != 0);
  }
  return local_4;
}

Assistant:

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed, int flag, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool res = fedObj->getFlagOption(flag);
        return (res) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}